

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferMalloc.cpp
# Opt level: O2

void __thiscall adios2::format::BufferMalloc::Resize(BufferMalloc *this,size_t size,string *hint)

{
  char *pcVar1;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (size != 0) {
    if (this->m_size == 0) {
      pcVar1 = (char *)malloc(size);
      this->m_buffer = pcVar1;
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_40,"Toolkit::Format",&local_101);
        std::__cxx11::string::string((string *)&local_60,"buffer::heap::BufferMalloc",&local_102);
        std::__cxx11::string::string((string *)&local_80,"BufferSystemV",&local_103);
        std::__cxx11::to_string(&local_100,size);
        std::operator+(&local_e0,"buffer overflow when resizing to ",&local_100);
        std::operator+(&local_c0,&local_e0," bytes, ");
        std::operator+(&local_a0,&local_c0,hint);
        helper::ThrowNested<std::runtime_error>(&local_40,&local_60,&local_80,&local_a0,-1);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
      }
    }
    else {
      pcVar1 = (char *)realloc(this->m_buffer,size);
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_40,"Toolkit::Format",&local_101);
        std::__cxx11::string::string((string *)&local_60,"buffer::heap::BufferMalloc",&local_102);
        std::__cxx11::string::string((string *)&local_80,"BufferSystemV",&local_103);
        std::__cxx11::to_string(&local_100,size);
        std::operator+(&local_e0,"buffer overflow when resizing to ",&local_100);
        std::operator+(&local_c0,&local_e0," bytes, ");
        std::operator+(&local_a0,&local_c0,hint);
        helper::ThrowNested<std::runtime_error>(&local_40,&local_60,&local_80,&local_a0,-1);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
      }
      this->m_buffer = pcVar1;
    }
    this->m_size = size;
  }
  return;
}

Assistant:

void BufferMalloc::Resize(const size_t size, const std::string hint)
{
    if (size == 0)
        return;
    if (m_size == 0)
    {
        m_buffer = (char *)malloc(size);
        if (m_buffer == NULL)
            helper::ThrowNested<std::runtime_error>(
                "Toolkit::Format", "buffer::heap::BufferMalloc", "BufferSystemV",
                "buffer overflow when resizing to " + std::to_string(size) + " bytes, " + hint);
    }
    else
    {
        char *tmp = (char *)realloc(m_buffer, size);
        if (tmp == NULL)
            helper::ThrowNested<std::runtime_error>(
                "Toolkit::Format", "buffer::heap::BufferMalloc", "BufferSystemV",
                "buffer overflow when resizing to " + std::to_string(size) + " bytes, " + hint);
        m_buffer = tmp;
    }
    m_size = size;
}